

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

int32 __thiscall nuraft::raft_server::get_num_voting_members(raft_server *this)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  element_type *peVar3;
  _Hash_node_base *p_Var4;
  int iVar5;
  int iVar6;
  
  p_Var1 = (this->peers_)._M_h._M_before_begin._M_nxt;
  iVar6 = 0;
  while( true ) {
    if (p_Var1 == (_Hash_node_base *)0x0) {
      return (this->im_learner_ ^ 1) + iVar6;
    }
    p_Var2 = p_Var1[2]._M_nxt;
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)(p_Var2 + 0x1b));
    if (iVar5 != 0) break;
    peVar3 = (this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var4 = (p_Var1[2]._M_nxt)->_M_nxt;
    if ((peVar3 == (element_type *)0x0) ||
       (((peVar3->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        )->id_ != *(int *)&p_Var4->_M_nxt)) {
      iVar6 = iVar6 + (*(byte *)&p_Var4[9]._M_nxt ^ 1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)(p_Var2 + 0x1b));
    p_Var1 = p_Var1->_M_nxt;
  }
  std::__throw_system_error(iVar5);
}

Assistant:

int32 raft_server::get_num_voting_members() {
    int32 count = 0;
    for (auto& entry: peers_) {
        ptr<peer>& p = entry.second;
        auto_lock(p->get_lock());
        if (!is_regular_member(p)) continue;
        count++;
    }
    if (!im_learner_) count++;
    return count;
}